

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O3

void helper_psllw_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  if (0xf < s->_q_ZMMReg[0]) {
    d->_q_ZMMReg[0] = 0;
    d->_q_ZMMReg[1] = 0;
    return;
  }
  iVar1 = (int)s->_q_ZMMReg[0];
  auVar3._0_4_ = (int)(short)(d->_w_ZMMReg[4] << iVar1);
  auVar3._4_4_ = (int)(short)d->_w_ZMMReg[5];
  auVar3._8_4_ = (int)(short)d->_w_ZMMReg[6];
  auVar3._12_4_ = (int)(short)d->_w_ZMMReg[7];
  auVar2._0_4_ = (int)(short)(d->_w_ZMMReg[0] << iVar1);
  auVar2._4_4_ = (int)(short)d->_w_ZMMReg[1];
  auVar2._8_4_ = (int)(short)d->_w_ZMMReg[2];
  auVar2._12_4_ = (int)(short)d->_w_ZMMReg[3];
  auVar2 = packssdw(auVar2,auVar3);
  *(undefined1 (*) [16])d = auVar2;
  return;
}

Assistant:

void glue(helper_psllw, SUFFIX)(CPUX86State *env, Reg *d, Reg *s)
{
    int shift;

    if (s->Q(0) > 15) {
        d->Q(0) = 0;
#if SHIFT == 1
        d->Q(1) = 0;
#endif
    } else {
        shift = s->B(0);
        d->W(0) <<= shift;
        d->W(1) <<= shift;
        d->W(2) <<= shift;
        d->W(3) <<= shift;
#if SHIFT == 1
        d->W(4) <<= shift;
        d->W(5) <<= shift;
        d->W(6) <<= shift;
        d->W(7) <<= shift;
#endif
    }
}